

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall CLI::App::immediate_callback(App *this,bool immediate)

{
  byte bVar1;
  bool bVar2;
  byte in_SIL;
  App *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  in_RDI->immediate_callback_ = (bool)bVar1;
  if ((in_RDI->immediate_callback_ & 1U) == 0) {
    bVar2 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1e05cb);
    if ((!bVar2) &&
       (bVar2 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1e05dc), bVar2)) {
      std::swap<void>((function<void_()> *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                      (function<void_()> *)in_RDI);
    }
  }
  else {
    bVar2 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1e058b);
    if ((bVar2) &&
       (bVar2 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1e059e), !bVar2)) {
      std::swap<void>((function<void_()> *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                      (function<void_()> *)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE App *App::immediate_callback(bool immediate) {
    immediate_callback_ = immediate;
    if(immediate_callback_) {
        if(final_callback_ && !(parse_complete_callback_)) {
            std::swap(final_callback_, parse_complete_callback_);
        }
    } else if(!(final_callback_) && parse_complete_callback_) {
        std::swap(final_callback_, parse_complete_callback_);
    }
    return this;
}